

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsSendQueue.cpp
# Opt level: O0

void __thiscall Scs::SendQueue::Push(SendQueue *this,void *data,size_t bytes)

{
  bool bVar1;
  unsigned_long *puVar2;
  vector<unsigned_char,Scs::Allocator<unsigned_char>> *pvVar3;
  element_type *peVar4;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>
  local_98;
  const_iterator local_90;
  uchar *local_88;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>
  local_80;
  const_iterator local_78;
  MessageHeader local_70;
  MessageHeader header;
  BufferPtr buffer;
  unsigned_long local_48;
  size_t bytesToWrite;
  __mutex_base *p_Stack_38;
  bool firstWrite;
  size_t bytesRemaining;
  uint8_t *ptrData;
  lock_guard<std::mutex> lock;
  size_t bytes_local;
  void *data_local;
  SendQueue *this_local;
  
  lock._M_device = (mutex_type *)bytes;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&ptrData,&this->m_mutex);
  p_Stack_38 = (__mutex_base *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8);
  bVar1 = true;
  bytesRemaining = (size_t)data;
  do {
    if (p_Stack_38 == (__mutex_base *)0x0) {
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ptrData);
      return;
    }
    puVar2 = std::min<unsigned_long>((unsigned_long *)&stack0xffffffffffffffc8,&SEND_BUFFER_SIZE);
    local_48 = *puVar2;
    CreateBuffer();
    if (bVar1) {
      if ((mutex_type *)0xfffffffe < lock._M_device) {
        __assert_fail("bytes < 0xFFFFFFFF",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/JamesBoer[P]Scs/Source/ScsSendQueue.cpp"
                      ,0x45,"void Scs::SendQueue::Push(const void *, size_t)");
      }
      MessageHeader::MessageHeader(&local_70);
      local_70.size = (uint32_t)lock._M_device;
      pvVar3 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
               std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&header);
      peVar4 = std::
               __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&header);
      local_80._M_current =
           (uchar *)std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::end(peVar4);
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
                  *)&local_78,&local_80);
      local_88 = (uchar *)std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::
                          insert<unsigned_char*,void>
                                    (pvVar3,local_78,(uchar *)&local_70,(uchar *)&header);
      p_Stack_38 = (__mutex_base *)((long)p_Stack_38 + -8);
      local_48 = local_48 - 8;
      bVar1 = false;
    }
    pvVar3 = (vector<unsigned_char,Scs::Allocator<unsigned_char>> *)
             std::
             __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&header);
    peVar4 = std::
             __shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&header);
    local_98._M_current =
         (uchar *)std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>::end(peVar4);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,Scs::Allocator<unsigned_char>>>
                *)&local_90,&local_98);
    std::vector<unsigned_char,Scs::Allocator<unsigned_char>>::insert<unsigned_char*,void>
              (pvVar3,local_90,(uchar *)bytesRemaining,(uchar *)(bytesRemaining + local_48));
    std::
    deque<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>,_Scs::Allocator<std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>_>_>
    ::push_back(&this->m_queue,(value_type *)&header);
    bytesRemaining = local_48 + bytesRemaining;
    p_Stack_38 = (__mutex_base *)((long)p_Stack_38 - local_48);
    std::shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_>::~shared_ptr
              ((shared_ptr<std::vector<unsigned_char,_Scs::Allocator<unsigned_char>_>_> *)&header);
  } while( true );
}

Assistant:

void SendQueue::Push(const void * data, size_t bytes)
{
	std::lock_guard<std::mutex> lock(m_mutex);

	// Track data and bytes remaining to queue
	uint8_t * ptrData = (uint8_t *)data;
	size_t bytesRemaining = bytes + sizeof(MessageHeader);
	bool firstWrite = true;
	while (bytesRemaining)
	{
		size_t bytesToWrite = std::min(bytesRemaining, SEND_BUFFER_SIZE);
		BufferPtr buffer = CreateBuffer();
		if (firstWrite)
		{
			// Single message sizes over 4GB aren't supported, which is a
			// ridiculous size for a single TCP/IP message anyhow.
			assert(bytes < 0xFFFFFFFF);
			MessageHeader header;
			header.size = static_cast<uint32_t>(bytes);	
			buffer->insert(buffer->end(), reinterpret_cast<uint8_t *>(&header), reinterpret_cast<uint8_t *>(&header) + sizeof(MessageHeader));
			bytesRemaining -= sizeof(MessageHeader);
			bytesToWrite -= sizeof(MessageHeader);
			firstWrite = false;
		}
		buffer->insert(buffer->end(), ptrData, ptrData + bytesToWrite);
		m_queue.push_back(buffer);
		ptrData += bytesToWrite;
		bytesRemaining -= bytesToWrite;
	}
	assert(bytesRemaining == 0);
}